

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

int secp256k1_ec_pubkey_create_helper
              (secp256k1_ecmult_gen_context *ecmult_gen_ctx,secp256k1_scalar *seckey_scalar,
              secp256k1_ge *p,uchar *seckey)

{
  int iVar1;
  int ret;
  secp256k1_gej pj;
  uchar *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff94;
  secp256k1_gej *in_stack_ffffffffffffff98;
  secp256k1_ge *in_stack_ffffffffffffffa0;
  
  iVar1 = secp256k1_scalar_set_b32_seckey
                    ((secp256k1_scalar *)
                     CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
  secp256k1_scalar_cmov
            ((secp256k1_scalar *)in_stack_ffffffffffffffa0,
             (secp256k1_scalar *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
  secp256k1_ecmult_gen
            ((secp256k1_ecmult_gen_context *)pj._144_8_,(secp256k1_gej *)pj.z._40_8_,
             (secp256k1_scalar *)pj.z.n[4]);
  secp256k1_ge_set_gej(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  secp256k1_gej_clear((secp256k1_gej *)0x1044a9);
  return iVar1;
}

Assistant:

static int secp256k1_ec_pubkey_create_helper(const secp256k1_ecmult_gen_context *ecmult_gen_ctx, secp256k1_scalar *seckey_scalar, secp256k1_ge *p, const unsigned char *seckey) {
    secp256k1_gej pj;
    int ret;

    ret = secp256k1_scalar_set_b32_seckey(seckey_scalar, seckey);
    secp256k1_scalar_cmov(seckey_scalar, &secp256k1_scalar_one, !ret);

    secp256k1_ecmult_gen(ecmult_gen_ctx, &pj, seckey_scalar);
    secp256k1_ge_set_gej(p, &pj);
    secp256k1_gej_clear(&pj);
    return ret;
}